

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricalCircuit::~IfcElectricalCircuit(IfcElectricalCircuit *this)

{
  ~IfcElectricalCircuit
            ((IfcElectricalCircuit *)
             (&(this->super_IfcSystem).super_IfcGroup.super_IfcObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcSystem).super_IfcGroup.super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcElectricalCircuit() : Object("IfcElectricalCircuit") {}